

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

bool units::precise::custom::is_custom_unit(unit_data *UT)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  unit_data *UT_local;
  
  iVar1 = detail::unit_data::mole(UT);
  iVar2 = detail::maxNeg(2);
  if (iVar1 == iVar2) {
    iVar1 = detail::unit_data::ampere(UT);
    lVar3 = (long)iVar1;
    if (lVar3 < 1) {
      lVar3 = -lVar3;
    }
    if (lVar3 < 2) {
      UT_local._7_1_ = false;
    }
    else {
      UT_local._7_1_ = true;
    }
  }
  else {
    UT_local._7_1_ = false;
  }
  return UT_local._7_1_;
}

Assistant:

inline bool is_custom_unit(const detail::unit_data& UT)
        {
            if (UT.mole() != detail::maxNeg(detail::bitwidth::mole)) {
                // mole is always -2 regardless of inversion
                return false;
            }
            if (std::labs(UT.ampere()) < 2) {
                // ampere is either -3 or -4  or 3 or 4
                return false;
            }
            return true;
        }